

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_auth.cc
# Opt level: O2

void __thiscall
prometheus::BasicAuthHandler::BasicAuthHandler
          (BasicAuthHandler *this,AuthFunc *callback,string *realm)

{
  (this->super_CivetAuthHandler)._vptr_CivetAuthHandler =
       (_func_int **)&PTR__BasicAuthHandler_0013cb10;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->callback_,callback);
  std::__cxx11::string::string((string *)&this->realm_,(string *)realm);
  return;
}

Assistant:

BasicAuthHandler::BasicAuthHandler(AuthFunc callback, std::string realm)
    : callback_(std::move(callback)), realm_(std::move(realm)) {}